

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.hpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderExecUtil::Symbol::Symbol(Symbol *this,string *name_,VarType *varType_)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  glu::VarType::VarType(&this->varType,varType_);
  return;
}

Assistant:

Symbol (const std::string& name_, const glu::VarType& varType_) : name(name_), varType(varType_) {}